

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall
mp::internal::TextReader<fmt::Locale>::ReadHeader(TextReader<fmt::Locale> *this,NLHeader *header)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  int *in_RSI;
  TextReader<fmt::Locale> *in_RDI;
  int max_vars;
  int arith_kind;
  bool all_compl;
  double tmp;
  int i;
  uint7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar5;
  BasicCStringRef<char> in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar6;
  TextReader<fmt::Locale> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar7;
  CStringRef in_stack_ffffffffffffffe0;
  BasicCStringRef<char> local_18;
  int *local_10;
  
  local_10 = in_RSI;
  cVar1 = ReaderBase::ReadChar(&in_RDI->super_ReaderBase);
  if (cVar1 == 'b') {
    local_10[0x2a] = 1;
  }
  else if (cVar1 == 'g') {
    local_10[0x2a] = 0;
  }
  else {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"expected format specifier");
    ReportError<>((TextReader<fmt::Locale> *)
                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  in_stack_ffffffffffffffe0);
  }
  ReadOptionalUInt(in_RDI,(int *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (9 < local_10[0x2b]) {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"too many options");
    ReportError<>((TextReader<fmt::Locale> *)
                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  in_stack_ffffffffffffffe0);
  }
  iVar7 = 0;
  while ((iVar7 < local_10[0x2b] &&
         (bVar2 = ReadOptionalDouble((TextReader<fmt::Locale> *)
                                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                     (double *)in_stack_ffffffffffffffc0.data_), bVar2))) {
    *(long *)(local_10 + (long)iVar7 * 2 + 0x2c) = (long)(double)in_stack_ffffffffffffffd0;
    if (((double)*(long *)(local_10 + (long)iVar7 * 2 + 0x2c) != (double)in_stack_ffffffffffffffd0)
       || (NAN((double)*(long *)(local_10 + (long)iVar7 * 2 + 0x2c)) ||
           NAN((double)in_stack_ffffffffffffffd0))) break;
    iVar7 = iVar7 + 1;
  }
  if (*(long *)(local_10 + 0x2e) == 3) {
    ReadOptionalDouble((TextReader<fmt::Locale> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (double *)in_stack_ffffffffffffffc0.data_);
  }
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167e15);
  *local_10 = iVar3;
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167e28);
  local_10[1] = iVar3;
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167e3c);
  local_10[2] = iVar3;
  local_10[4] = -1;
  bVar2 = ReadOptionalUInt(in_RDI,(int *)CONCAT17(in_stack_ffffffffffffffaf,
                                                  in_stack_ffffffffffffffa8));
  if ((bVar2) &&
     (bVar2 = ReadOptionalUInt(in_RDI,(int *)CONCAT17(in_stack_ffffffffffffffaf,
                                                      in_stack_ffffffffffffffa8)), bVar2)) {
    ReadOptionalUInt(in_RDI,(int *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  }
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167eab);
  local_10[0xc] = iVar3;
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167ebf);
  local_10[0xd] = iVar3;
  bVar2 = ReadOptionalUInt(in_RDI,(int *)CONCAT17(in_stack_ffffffffffffffaf,
                                                  in_stack_ffffffffffffffa8));
  uVar5 = false;
  if (bVar2) {
    bVar2 = ReadOptionalUInt(in_RDI,(int *)(ulong)in_stack_ffffffffffffffa8);
    uVar5 = false;
    if (bVar2) {
      bVar2 = ReadOptionalUInt(in_RDI,(int *)(ulong)in_stack_ffffffffffffffa8);
      uVar5 = false;
      if (bVar2) {
        uVar5 = ReadOptionalUInt(in_RDI,(int *)(ulong)in_stack_ffffffffffffffa8);
      }
    }
  }
  uVar6 = CONCAT13(uVar5,(int3)in_stack_ffffffffffffffcc);
  local_10[0xe] = local_10[0xf] + local_10[0xe];
  if ((0 < local_10[0xe]) && ((bool)uVar5 == false)) {
    local_10[0x10] = -1;
  }
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167f95);
  local_10[0x12] = iVar3;
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167fa9);
  local_10[0x13] = iVar3;
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167fc7);
  local_10[0x14] = iVar3;
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x167fdb);
  local_10[0x15] = iVar3;
  local_10[0x16] = -1;
  ReadOptionalUInt(in_RDI,(int *)CONCAT17(uVar5,in_stack_ffffffffffffffa8));
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x168018);
  local_10[0x17] = iVar3;
  iVar3 = ReadUInt((TextReader<fmt::Locale> *)0x16802c);
  local_10[0x18] = iVar3;
  iVar3 = 0;
  bVar2 = ReadOptionalUInt(in_RDI,(int *)CONCAT17(uVar5,in_stack_ffffffffffffffa8));
  if (bVar2) {
    if (5 < iVar3) {
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffffc0,
                 "unknown floating-point arithmetic kind");
      ReportError<>((TextReader<fmt::Locale> *)CONCAT44(iVar7,in_stack_ffffffffffffffd8),
                    in_stack_ffffffffffffffe0);
    }
    local_10[0x42] = iVar3;
    ReadOptionalUInt(in_RDI,(int *)CONCAT17(uVar5,in_stack_ffffffffffffffa8));
  }
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  iVar7 = ReadUInt((TextReader<fmt::Locale> *)0x1680b7);
  local_10[0x19] = iVar7;
  iVar7 = ReadUInt((TextReader<fmt::Locale> *)0x1680cb);
  local_10[0x1a] = iVar7;
  if (-1 < local_10[0x16]) {
    iVar7 = ReadUInt((TextReader<fmt::Locale> *)0x1680ea);
    local_10[0x1b] = iVar7;
    iVar7 = ReadUInt((TextReader<fmt::Locale> *)0x1680fe);
    local_10[0x1c] = iVar7;
    iVar7 = ReadUInt((TextReader<fmt::Locale> *)0x168112);
    local_10[0x1d] = iVar7;
  }
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  uVar4 = ReadUInt<unsigned_long>((TextReader<fmt::Locale> *)in_stack_ffffffffffffffc0.data_);
  *(unsigned_long *)(local_10 + 0x1e) = uVar4;
  uVar4 = ReadUInt<unsigned_long>((TextReader<fmt::Locale> *)in_stack_ffffffffffffffc0.data_);
  *(unsigned_long *)(local_10 + 0x20) = uVar4;
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  iVar7 = ReadUInt((TextReader<fmt::Locale> *)0x168169);
  local_10[0x22] = iVar7;
  iVar7 = ReadUInt((TextReader<fmt::Locale> *)0x168180);
  local_10[0x23] = iVar7;
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  iVar7 = ReadUInt(in_stack_ffffffffffffffd0,(int *)CONCAT44(uVar6,iVar3));
  local_10[0x24] = iVar7;
  iVar7 = ReadUInt(in_stack_ffffffffffffffd0,(int *)CONCAT44(uVar6,iVar3));
  local_10[0x25] = iVar7;
  iVar7 = ReadUInt(in_stack_ffffffffffffffd0,(int *)CONCAT44(uVar6,iVar3));
  local_10[0x26] = iVar7;
  iVar7 = ReadUInt(in_stack_ffffffffffffffd0,(int *)CONCAT44(uVar6,iVar3));
  local_10[0x27] = iVar7;
  iVar7 = ReadUInt(in_stack_ffffffffffffffd0,(int *)CONCAT44(uVar6,iVar3));
  local_10[0x28] = iVar7;
  ReadTillEndOfLine(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void mp::internal::TextReader<Locale>::ReadHeader(NLHeader &header) {
  // Read the format (text or binary).
  switch (ReadChar()) {
  case 'g':
    header.format = NLHeader::TEXT;
    break;
  case 'b':
    header.format = NLHeader::BINARY;
    break;
  default:
    ReportError("expected format specifier");
    break;
  }

  // Read options.
  ReadOptionalUInt(header.num_ampl_options);
  if (header.num_ampl_options > MAX_AMPL_OPTIONS)
    ReportError("too many options");
  for (int i = 0; i < header.num_ampl_options; ++i) {
    double tmp;
    if (!ReadOptionalDouble(tmp))
      break;
    header.ampl_options[i] = (long)tmp;
    if (header.ampl_options[i] != tmp)
      break;
  }
  if (header.ampl_options[USE_VBTOL_OPTION] == READ_VBTOL)
    ReadOptionalDouble(header.ampl_vbtol);
  ReadTillEndOfLine();

  // Read problem dimensions.
  header.num_vars = ReadUInt();
  header.num_algebraic_cons = ReadUInt();
  header.num_objs = ReadUInt();
  header.num_eqns = -1;
  if (ReadOptionalUInt(header.num_ranges) &&
      ReadOptionalUInt(header.num_eqns)) {
      ReadOptionalUInt(header.num_logical_cons);
  }
  ReadTillEndOfLine();

  // Read the nonlinear and complementarity information.
  header.num_nl_cons = ReadUInt();
  header.num_nl_objs = ReadUInt();
  bool all_compl =
      ReadOptionalUInt(header.num_compl_conds) &&
      ReadOptionalUInt(header.num_nl_compl_conds) &&
      ReadOptionalUInt(header.num_compl_dbl_ineqs) &&
      ReadOptionalUInt(header.num_compl_vars_with_nz_lb);
  header.num_compl_conds += header.num_nl_compl_conds;
  if (header.num_compl_conds > 0 && !all_compl)
    header.num_compl_dbl_ineqs = -1;
  ReadTillEndOfLine();

  // Read the information about network constraints.
  header.num_nl_net_cons = ReadUInt();
  header.num_linear_net_cons = ReadUInt();
  ReadTillEndOfLine();

  // Read the information about nonlinear variables.
  header.num_nl_vars_in_cons = ReadUInt();
  header.num_nl_vars_in_objs = ReadUInt();
  header.num_nl_vars_in_both = -1;
  ReadOptionalUInt(header.num_nl_vars_in_both);
  ReadTillEndOfLine();

  header.num_linear_net_vars = ReadUInt();
  header.num_funcs = ReadUInt();
  int arith_kind = 0;
  if (ReadOptionalUInt(arith_kind)) {
    if (arith_kind > arith::LAST)
      ReportError("unknown floating-point arithmetic kind");
    header.arith_kind = arith_kind;
    ReadOptionalUInt(header.flags);
  }
  ReadTillEndOfLine();

  // Read the information about discrete variables.
  header.num_linear_binary_vars = ReadUInt();
  header.num_linear_integer_vars = ReadUInt();
  if (header.num_nl_vars_in_both >= 0) {  // ampl versions >= 19930630
    header.num_nl_integer_vars_in_both = ReadUInt();
    header.num_nl_integer_vars_in_cons = ReadUInt();
    header.num_nl_integer_vars_in_objs = ReadUInt();
  }
  ReadTillEndOfLine();

  // Read the information about nonzeros.
  header.num_con_nonzeros = ReadUInt<std::size_t>();
  header.num_obj_nonzeros = ReadUInt<std::size_t>();
  ReadTillEndOfLine();

  // Read the information about names.
  header.max_con_name_len = ReadUInt();
  header.max_var_name_len = ReadUInt();
  ReadTillEndOfLine();

  // Read the information about common expressions checking for overflow
  // as the variable indices go from 0 to num_vars + num_common_exprs.
  int max_vars = header.num_vars;
  header.num_common_exprs_in_both = ReadUInt(max_vars);
  header.num_common_exprs_in_cons = ReadUInt(max_vars);
  header.num_common_exprs_in_objs = ReadUInt(max_vars);
  header.num_common_exprs_in_single_cons = ReadUInt(max_vars);
  header.num_common_exprs_in_single_objs = ReadUInt(max_vars);
  ReadTillEndOfLine();
}